

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool __thiscall cmake::Open(cmake *this,string *dir,bool dryRun)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  pointer pcVar4;
  string *psVar5;
  pointer pcVar6;
  string *psVar7;
  allocator<char> local_189;
  string local_188;
  cmValue local_168;
  cmValue cachedProjectName;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> gen;
  string local_150;
  undefined1 local_130 [8];
  string fullName;
  string local_108;
  cmValue local_e8;
  cmValue extraGenName;
  string local_d8;
  cmValue local_b8;
  cmValue genName;
  undefined1 local_a8 [8];
  string cachePath;
  string local_80;
  allocator<char> local_49;
  string local_48;
  byte local_21;
  string *psStack_20;
  bool dryRun_local;
  string *dir_local;
  cmake *this_local;
  
  local_21 = dryRun;
  psStack_20 = dir;
  dir_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  SetHomeDirectory(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"",(allocator<char> *)(cachePath.field_2._M_local_buf + 0xf));
  SetHomeOutputDirectory(this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)(cachePath.field_2._M_local_buf + 0xf));
  bVar1 = cmsys::SystemTools::FileIsDirectory(psStack_20);
  if (bVar1) {
    FindCacheFile((string *)local_a8,psStack_20);
    bVar1 = LoadCache(this,(string *)local_a8);
    if (bVar1) {
      pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"CMAKE_GENERATOR",
                 (allocator<char> *)((long)&extraGenName.Value + 7));
      local_b8 = cmState::GetCacheEntryValue(pcVar4,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&extraGenName.Value + 7));
      bVar1 = cmValue::operator_cast_to_bool(&local_b8);
      if (bVar1) {
        pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"CMAKE_EXTRA_GENERATOR",
                   (allocator<char> *)(fullName.field_2._M_local_buf + 0xf));
        local_e8 = cmState::GetInitializedCacheValue(pcVar4,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator((allocator<char> *)(fullName.field_2._M_local_buf + 0xf));
        psVar5 = cmValue::operator*[abi_cxx11_(&local_b8);
        bVar1 = cmValue::operator_cast_to_bool(&local_e8);
        gen._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
        _M_t.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
        super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl._6_1_ = 0;
        if (bVar1) {
          psVar7 = cmValue::operator*[abi_cxx11_(&local_e8);
          std::__cxx11::string::string((string *)&local_150,(string *)psVar7);
        }
        else {
          std::allocator<char>::allocator();
          gen._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
          ._M_t.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
          .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl._6_1_ = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_150,"",
                     (allocator<char> *)
                     ((long)&gen._M_t.
                             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                             .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 7));
        }
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                  ((string *)local_130,psVar5,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        if ((gen._M_t.
             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl._6_1_ & 1) != 0) {
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&gen._M_t.
                             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                             .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 7));
        }
        CreateGlobalGenerator((cmake *)&cachedProjectName,(string *)this,SUB81(local_130,0));
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&cachedProjectName);
        if (bVar1) {
          pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State)
          ;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_188,"CMAKE_PROJECT_NAME",&local_189);
          local_168 = cmState::GetCacheEntryValue(pcVar4,&local_188);
          std::__cxx11::string::~string((string *)&local_188);
          std::allocator<char>::~allocator(&local_189);
          bVar1 = cmValue::operator_cast_to_bool(&local_168);
          if (bVar1) {
            pcVar6 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                     operator->((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                                 *)&cachedProjectName);
            psVar5 = psStack_20;
            psVar7 = cmValue::operator*[abi_cxx11_(&local_168);
            iVar2 = (*pcVar6->_vptr_cmGlobalGenerator[0x12])
                              (pcVar6,psVar5,psVar7,(ulong)(local_21 & 1));
            this_local._7_1_ = (byte)iVar2 & 1;
          }
          else {
            std::operator<<((ostream *)&std::cerr,
                            "Error: could not find CMAKE_PROJECT_NAME in Cache\n");
            this_local._7_1_ = 0;
          }
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "Error: could not create CMAKE_GENERATOR \"");
          poVar3 = std::operator<<(poVar3,(string *)local_130);
          std::operator<<(poVar3,"\"\n");
          this_local._7_1_ = 0;
        }
        genName.Value._4_4_ = 1;
        std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
                  ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                   &cachedProjectName);
        std::__cxx11::string::~string((string *)local_130);
      }
      else {
        std::operator<<((ostream *)&std::cerr,"Error: could not find CMAKE_GENERATOR in Cache\n");
        this_local._7_1_ = 0;
        genName.Value._4_4_ = 1;
      }
    }
    else {
      std::operator<<((ostream *)&std::cerr,"Error: could not load cache\n");
      this_local._7_1_ = 0;
      genName.Value._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_a8);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar3 = std::operator<<(poVar3,(string *)psStack_20);
    std::operator<<(poVar3," is not a directory\n");
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmake::Open(const std::string& dir, bool dryRun)
{
  this->SetHomeDirectory("");
  this->SetHomeOutputDirectory("");
  if (!cmSystemTools::FileIsDirectory(dir)) {
    std::cerr << "Error: " << dir << " is not a directory\n";
    return false;
  }

  std::string cachePath = FindCacheFile(dir);
  if (!this->LoadCache(cachePath)) {
    std::cerr << "Error: could not load cache\n";
    return false;
  }
  cmValue genName = this->State->GetCacheEntryValue("CMAKE_GENERATOR");
  if (!genName) {
    std::cerr << "Error: could not find CMAKE_GENERATOR in Cache\n";
    return false;
  }
  cmValue extraGenName =
    this->State->GetInitializedCacheValue("CMAKE_EXTRA_GENERATOR");
  std::string fullName =
    cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
      *genName, extraGenName ? *extraGenName : "");

  std::unique_ptr<cmGlobalGenerator> gen =
    this->CreateGlobalGenerator(fullName);
  if (!gen) {
    std::cerr << "Error: could not create CMAKE_GENERATOR \"" << fullName
              << "\"\n";
    return false;
  }

  cmValue cachedProjectName =
    this->State->GetCacheEntryValue("CMAKE_PROJECT_NAME");
  if (!cachedProjectName) {
    std::cerr << "Error: could not find CMAKE_PROJECT_NAME in Cache\n";
    return false;
  }

  return gen->Open(dir, *cachedProjectName, dryRun);
}